

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall kj::String::~String(String *this)

{
  String *this_local;
  
  Array<char>::~Array(&this->content);
  return;
}

Assistant:

String() = default;